

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MTexPoly>
          (Structure *this,MTexPoly *dest,FileDatabase *db)

{
  element_type *peVar1;
  element_type *this_00;
  undefined1 local_30 [8];
  shared_ptr<Assimp::Blender::Image> tpage;
  FileDatabase *db_local;
  MTexPoly *dest_local;
  Structure *this_local;
  
  tpage.super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)db;
  ::std::shared_ptr<Assimp::Blender::Image>::shared_ptr
            ((shared_ptr<Assimp::Blender::Image> *)local_30);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Image>
            (this,(shared_ptr<Assimp::Blender::Image> *)local_30,"*tpage",
             (FileDatabase *)
             tpage.super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,false);
  peVar1 = ::std::__shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2> *)local_30);
  dest->tpage = peVar1;
  ::std::shared_ptr<Assimp::Blender::Image>::~shared_ptr
            ((shared_ptr<Assimp::Blender::Image> *)local_30);
  ReadField<1,char>(this,&dest->flag,"flag",
                    (FileDatabase *)
                    tpage.super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  ReadField<1,char>(this,&dest->transp,"transp",
                    (FileDatabase *)
                    tpage.super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  ReadField<1,short>(this,&dest->mode,"mode",
                     (FileDatabase *)
                     tpage.super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  ReadField<1,short>(this,&dest->tile,"tile",
                     (FileDatabase *)
                     tpage.super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  ReadField<1,short>(this,&dest->pad,"pad",
                     (FileDatabase *)
                     tpage.super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(tpage.
                             super___shared_ptr<Assimp::Blender::Image,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 8));
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<MTexPoly> (
    MTexPoly& dest,
    const FileDatabase& db
    ) const
{

    {
        std::shared_ptr<Image> tpage;
        ReadFieldPtr<ErrorPolicy_Igno>(tpage,"*tpage",db);
        dest.tpage = tpage.get();
    }
    ReadField<ErrorPolicy_Igno>(dest.flag,"flag",db);
    ReadField<ErrorPolicy_Igno>(dest.transp,"transp",db);
    ReadField<ErrorPolicy_Igno>(dest.mode,"mode",db);
    ReadField<ErrorPolicy_Igno>(dest.tile,"tile",db);
    ReadField<ErrorPolicy_Igno>(dest.pad,"pad",db);

    db.reader->IncPtr(size);
}